

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample.h
# Opt level: O0

fid __thiscall ezexample::hash(ezexample *this,char c,string *fstr)

{
  uint64_t uVar1;
  string *in_RDX;
  vw *all;
  undefined1 in_SIL;
  undefined8 *in_RDI;
  string *s;
  string *s_00;
  vw *in_stack_ffffffffffffff90;
  undefined1 local_59 [33];
  string local_38 [56];
  
  all = (vw *)((long)in_RDI + 0x11);
  *(undefined1 *)((long)in_RDI + 0x11) = in_SIL;
  std::__cxx11::string::string(local_38,in_RDX);
  s = (string *)*in_RDI;
  s_00 = (string *)local_59;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_59 + 1),(char *)all,(allocator *)s_00);
  VW::hash_space(all,s);
  uVar1 = VW::hash_feature(in_stack_ffffffffffffff90,s_00,(uint64_t)all);
  std::__cxx11::string::~string((string *)(local_59 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_59);
  std::__cxx11::string::~string(local_38);
  return (fid)uVar1;
}

Assistant:

inline fid hash(char c, std::string fstr)
  {
    str[0] = c;
    return VW::hash_feature(*vw_ref, fstr, VW::hash_space(*vw_ref, str));
  }